

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicHeap.hpp
# Opt level: O1

void __thiscall
Lib::
DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
::fixDecrease1(DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
               *this,size_t idx)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ArrayMapEntry<unsigned_int> *pAVar4;
  Comparison CVar5;
  ulong uVar6;
  
  while( true ) {
    if (idx < 2) {
      return;
    }
    uVar6 = idx >> 1;
    puVar3 = (this->_heap)._array;
    CVar5 = DP::SimpleCongruenceClosure::ConstOrderingComparator::compare
                      (&this->_cmp,puVar3[uVar6 - 1],puVar3[idx - 1]);
    if (CVar5 != GREATER) break;
    puVar3 = (this->_heap)._array;
    uVar1 = puVar3[idx - 1];
    puVar3[idx - 1] = puVar3[uVar6 - 1];
    puVar3[uVar6 - 1] = uVar1;
    uVar1 = puVar3[idx - 1];
    pAVar4 = (this->_elMap).super_DArray<Lib::ArrayMapEntry<unsigned_int>_>._array;
    pAVar4[uVar1]._obj = (uint)idx;
    uVar2 = (this->_elMap)._timestamp;
    pAVar4[uVar1]._timestamp = uVar2;
    uVar1 = puVar3[uVar6 - 1];
    pAVar4[uVar1]._obj = (uint)uVar6;
    pAVar4[uVar1]._timestamp = uVar2;
    idx = uVar6;
  }
  return;
}

Assistant:

void fixDecrease1(size_t idx)
  {
    ASS_G(idx, 0);
    ASS_LE(idx, size());

    while(idx>1) {
      size_t parent = idx/2;
      if(!isGreater1(parent, idx)) {
	break;
      }
      swapInHeap1(idx, parent);
      idx = parent;
    }
  }